

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlFreeParserCtxt(PyObject *self,PyObject *args)

{
  PyTypeObject *pPVar1;
  int iVar2;
  PyObject *local_40;
  xmlParserCtxtPyCtxtPtr pyCtxt;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  PyObject *args_local;
  PyObject *self_local;
  
  ctxt = (xmlParserCtxtPtr)args;
  args_local = self;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeParserCtxt",&pyCtxt);
  if (iVar2 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (pyCtxt == (xmlParserCtxtPyCtxtPtr)&_Py_NoneStruct) {
      local_40 = (PyObject *)0x0;
    }
    else {
      local_40 = pyCtxt[1].f;
    }
    pyobj_ctxt = local_40;
    if (local_40 != (PyObject *)0x0) {
      pPVar1 = local_40[0x1a].ob_type;
      if (pPVar1 != (PyTypeObject *)0x0) {
        _Py_XDECREF((PyObject *)(pPVar1->ob_base).ob_base.ob_refcnt);
        _Py_XDECREF((PyObject *)(pPVar1->ob_base).ob_base.ob_type);
        (*_xmlFree)(pPVar1);
      }
      xmlFreeParserCtxt(pyobj_ctxt);
    }
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlFreeParserCtxt(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeParserCtxt", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    if (ctxt != NULL) {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)((xmlParserCtxtPtr)ctxt)->_private;
	if (pyCtxt) {
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	xmlFreeParserCtxt(ctxt);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}